

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumDescriptor.cpp
# Opt level: O0

KBOOL KDIS::DATA_TYPE::ENUMS::GetEnumFromString
                (EnumDescriptor *pArray,KUINT32 NumElements,KString *Value,KINT32 *ValueOut)

{
  bool bVar1;
  uint local_34;
  KINT32 i;
  KINT32 *ValueOut_local;
  KString *Value_local;
  KUINT32 NumElements_local;
  EnumDescriptor *pArray_local;
  
  local_34 = 0;
  while( true ) {
    if (NumElements <= local_34) {
      return false;
    }
    bVar1 = std::operator==(Value,pArray[(int)local_34].Name);
    if (bVar1) break;
    local_34 = local_34 + 1;
  }
  *ValueOut = pArray[(int)local_34].Value;
  return true;
}

Assistant:

KBOOL KDIS::DATA_TYPE::ENUMS::GetEnumFromString( const EnumDescriptor * pArray, KUINT32 NumElements, const KString & Value, KINT32 & ValueOut )
{
    for( KINT32 i = 0; i < NumElements; ++i )
    {
        if( Value == pArray[i].Name )
        {
            ValueOut = pArray[i].Value;
            return true;
        }
    }

    // No match found
    return false;
}